

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_locale.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
to<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
        string *utf8)

{
  pointer pcVar1;
  uint uVar2;
  ostream *poVar3;
  runtime_error *this;
  ulong uVar4;
  uint i;
  string local_1c0;
  ostringstream ss;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  i = 0;
  while( true ) {
    uVar4 = (ulong)i;
    if (utf8->_M_string_length <= uVar4) {
      return __return_storage_ptr__;
    }
    uVar2 = utf8_next(utf8,&i);
    if (0xff < uVar2) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar3 = std::operator<<((ostream *)&ss,"Can\'t convert codepoint U");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"(");
  pcVar1 = (utf8->_M_dataplus)._M_p;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_1c0,pcVar1 + uVar4,pcVar1 + i);
  poVar3 = std::operator<<(poVar3,(string *)&local_1c0);
  std::operator<<(poVar3,") to Latin1");
  std::__cxx11::string::~string((string *)&local_1c0);
  this = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  booster::runtime_error::runtime_error(this,&local_1c0);
  __cxa_throw(this,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

std::basic_string<Char> to(std::string const &utf8)
{
    std::basic_string<Char> out;
    unsigned i=0;
    while(i<utf8.size()) {
        unsigned point;
        unsigned prev=i;
        point = utf8_next(utf8,i);
        if(sizeof(Char)==1 && point > 255) {
            std::ostringstream ss;
            ss << "Can't convert codepoint U" << std::hex << point <<"(" <<std::string(utf8.begin()+prev,utf8.begin()+i)<<") to Latin1";
            throw booster::runtime_error(ss.str());
        }
        else if(sizeof(Char)==2 && point >0xFFFF) { // Deal with surragates
            point-=0x10000;
            out+=static_cast<Char>(0xD800 | (point>>10));
            out+=static_cast<Char>(0xDC00 | (point & 0x3FF));
            continue;
        }
        out+=static_cast<Char>(point);
    }
    return out;
}